

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O0

filtration_entry_t __thiscall
tournser::
add_coboundary_and_get_pivot<priority_queue_t<std::vector<filtration_entry_t,std::allocator<filtration_entry_t>>,greater_filtration_or_smaller_index<filtration_entry_t>>,std::_Deque_iterator<filtration_entry_t,filtration_entry_t_const&,filtration_entry_t_const*>>
          (tournser *this,
          _Deque_iterator<filtration_entry_t,_const_filtration_entry_t_&,_const_filtration_entry_t_*>
          *column_begin,
          _Deque_iterator<filtration_entry_t,_const_filtration_entry_t_&,_const_filtration_entry_t_*>
          *column_end,
          priority_queue_t<std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
          *working_coboundary,index_t *dim,
          priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_smaller_index<filtration_entry_t>_>
          *reduction_column)

{
  bool bVar1;
  reference pfVar2;
  filtration_entry_t fVar3;
  filtration_entry_t fVar4;
  undefined1 local_c0 [8];
  filtration_entry_t coface;
  undefined1 local_a0 [8];
  simplex_coboundary_enumerator cofaces;
  filtration_entry_t simplex;
  _Deque_iterator<filtration_entry_t,_const_filtration_entry_t_&,_const_filtration_entry_t_*> it;
  index_t iterations;
  priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_smaller_index<filtration_entry_t>_>
  *reduction_column_local;
  index_t *dim_local;
  priority_queue_t<std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
  *working_coboundary_local;
  _Deque_iterator<filtration_entry_t,_const_filtration_entry_t_&,_const_filtration_entry_t_*>
  *column_end_local;
  _Deque_iterator<filtration_entry_t,_const_filtration_entry_t_&,_const_filtration_entry_t_*>
  *column_begin_local;
  tournser *this_local;
  long local_10;
  
  it._M_node = (_Map_pointer)0x0;
  std::_Deque_iterator<filtration_entry_t,_const_filtration_entry_t_&,_const_filtration_entry_t_*>::
  _Deque_iterator((_Deque_iterator<filtration_entry_t,_const_filtration_entry_t_&,_const_filtration_entry_t_*>
                   *)&simplex.super_pair<float,_long>.second,column_begin);
  do {
    bVar1 = std::operator!=((_Self *)&simplex.super_pair<float,_long>.second,column_end);
    if (!bVar1) {
      fVar3 = priority_queue_t<std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
              ::get_pivot(working_coboundary);
      local_10 = fVar3.super_pair<float,_long>.second;
      this_local._0_4_ = fVar3.super_pair<float,_long>.first;
LAB_00192430:
      fVar4.super_pair<float,_long>._4_4_ = 0;
      fVar4.super_pair<float,_long>.first = this_local._0_4_;
      fVar4.super_pair<float,_long>.second = local_10;
      return (filtration_entry_t)fVar4.super_pair<float,_long>;
    }
    pfVar2 = std::
             _Deque_iterator<filtration_entry_t,_const_filtration_entry_t_&,_const_filtration_entry_t_*>
             ::operator*((_Deque_iterator<filtration_entry_t,_const_filtration_entry_t_&,_const_filtration_entry_t_*>
                          *)&simplex.super_pair<float,_long>.second);
    cofaces.complex = *(delta_complex_t **)&pfVar2->super_pair<float,_long>;
    simplex.super_pair<float,_long>._0_8_ = (pfVar2->super_pair<float,_long>).second;
    std::
    priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_smaller_index<filtration_entry_t>_>
    ::push(reduction_column,(value_type *)&cofaces.complex);
    std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>::clear
              (&this->coface_entries);
    coface.super_pair<float,_long>.second = (long)cofaces.complex;
    fVar3.super_pair<float,_long>._0_8_ = (ulong)cofaces.complex & 0xffffffff;
    fVar3.super_pair<float,_long>.second = simplex.super_pair<float,_long>._0_8_;
    simplex_coboundary_enumerator::simplex_coboundary_enumerator
              ((simplex_coboundary_enumerator *)local_a0,fVar3,*dim,this->complex);
    while( true ) {
      bVar1 = simplex_coboundary_enumerator::has_next((simplex_coboundary_enumerator *)local_a0);
      if (!bVar1) break;
      fVar3 = simplex_coboundary_enumerator::next((simplex_coboundary_enumerator *)local_a0);
      coface.super_pair<float,_long>._0_8_ = fVar3.super_pair<float,_long>.second;
      local_c0._0_4_ = fVar3.super_pair<float,_long>.first;
      it._M_node = (_Map_pointer)((long)it._M_node + 1);
      priority_queue_t<std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
      ::push(working_coboundary,(filtration_entry_t *)local_c0);
    }
    if ((_Map_pointer)this->max_entries < it._M_node) {
      filtration_entry_t::filtration_entry_t((filtration_entry_t *)&this_local,0,-2);
      goto LAB_00192430;
    }
    std::_Deque_iterator<filtration_entry_t,_const_filtration_entry_t_&,_const_filtration_entry_t_*>
    ::operator++((_Deque_iterator<filtration_entry_t,_const_filtration_entry_t_&,_const_filtration_entry_t_*>
                  *)&simplex.super_pair<float,_long>.second);
  } while( true );
}

Assistant:

filtration_entry_t tournser::add_coboundary_and_get_pivot(
    Iterator column_begin, Iterator column_end,
    Column& working_coboundary, const index_t& dim,
    std::priority_queue<filtration_entry_t, std::deque<filtration_entry_t>, smaller_index<filtration_entry_t>>& reduction_column) {
	index_t iterations = 0;
	for (auto it = column_begin; it != column_end; ++it) {
		filtration_entry_t simplex = *it;

        reduction_column.push(simplex);

		coface_entries.clear();
		simplex_coboundary_enumerator cofaces(simplex, dim, complex);
		while (cofaces.has_next()) {
			filtration_entry_t coface = cofaces.next();

            iterations++;
            working_coboundary.push(coface);
		}
		if (iterations > max_entries) {
			return filtration_entry_t(0,-2);
		}
	}

	return working_coboundary.get_pivot();
}